

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O0

void __thiscall KDReports::ImageElement::setImage(ImageElement *this,QImage *image)

{
  pointer pIVar1;
  QSize QVar2;
  enable_if_t<std::is_copy_constructible_v<QImage>,_QVariant> local_38;
  QImage *local_18;
  QImage *image_local;
  ImageElement *this_local;
  
  local_18 = image;
  image_local = (QImage *)this;
  QVariant::fromValue<QImage>(&local_38,image);
  pIVar1 = std::
           unique_ptr<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ::operator->(&this->d);
  QVariant::operator=(&pIVar1->m_pixmap,&local_38);
  QVariant::~QVariant(&local_38);
  QVar2 = (QSize)QImage::size();
  pIVar1 = std::
           unique_ptr<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ::operator->(&this->d);
  pIVar1->m_pixmapSize = QVar2;
  return;
}

Assistant:

void KDReports::ImageElement::setImage(const QImage &image)
{
    d->m_pixmap = QVariant::fromValue(image);
    d->m_pixmapSize = image.size();
}